

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall
Fossilize::DatabaseInterface::promote_sub_database_to_whitelist(DatabaseInterface *this,uint index)

{
  value_type_conflict3 local_4;
  
  if (this->impl->mode == ReadOnly) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->impl->sub_databases_in_whitelist,&local_4);
  }
  return;
}

Assistant:

void DatabaseInterface::promote_sub_database_to_whitelist(unsigned index)
{
	if (impl->mode != DatabaseMode::ReadOnly)
		return;

	impl->sub_databases_in_whitelist.push_back(index);
}